

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kinsol.c
# Opt level: O3

int KINSol(void *kinmem,N_Vector u,int strategy_in,N_Vector u_scale,N_Vector f_scale)

{
  double *pdVar1;
  code *pcVar2;
  undefined8 uVar3;
  undefined8 uVar4;
  long lVar5;
  undefined1 auVar6 [16];
  int iVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  char *pcVar11;
  undefined4 in_register_00000014;
  char *extraout_RDX;
  char *extraout_RDX_00;
  char *extraout_RDX_01;
  char *module;
  char *module_00;
  char *extraout_RDX_02;
  char *extraout_RDX_03;
  char *extraout_RDX_04;
  char *extraout_RDX_05;
  char *extraout_RDX_06;
  char *module_01;
  char *module_02;
  char *extraout_RDX_07;
  char *extraout_RDX_08;
  char *extraout_RDX_09;
  char *extraout_RDX_10;
  char *module_03;
  char *module_04;
  char *extraout_RDX_11;
  char *extraout_RDX_12;
  char *extraout_RDX_13;
  char *extraout_RDX_14;
  char *module_05;
  char *extraout_RDX_15;
  char *extraout_RDX_16;
  char *extraout_RDX_17;
  char *module_06;
  char *extraout_RDX_18;
  char *extraout_RDX_19;
  char *module_07;
  char *extraout_RDX_20;
  char *extraout_RDX_21;
  char *extraout_RDX_22;
  char *extraout_RDX_23;
  char *extraout_RDX_24;
  char *module_08;
  char *extraout_RDX_25;
  char *extraout_RDX_26;
  char *module_09;
  char *extraout_RDX_27;
  char *extraout_RDX_28;
  char *module_10;
  char *extraout_RDX_29;
  char *extraout_RDX_30;
  char *extraout_RDX_31;
  char *extraout_RDX_32;
  char *module_11;
  char *module_12;
  char *extraout_RDX_33;
  char *extraout_RDX_34;
  uint uVar12;
  long lVar13;
  KINMem pKVar14;
  char *pcVar15;
  N_Vector p_Var16;
  N_Vector p_Var17;
  bool bVar18;
  undefined8 uVar19;
  sunrealtype sVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  undefined8 extraout_XMM0_Qb;
  undefined8 extraout_XMM0_Qb_00;
  double dVar25;
  double dVar26;
  double dVar27;
  undefined4 uVar28;
  undefined4 uVar29;
  double dVar30;
  double dVar31;
  sunrealtype *psVar32;
  double local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  undefined1 local_c8 [16];
  double local_b8;
  double local_a8;
  double local_98;
  undefined8 local_88;
  
  if (kinmem == (void *)0x0) {
    pcVar11 = "KINSol";
    pcVar15 = "kinsol_mem = NULL illegal.";
    uVar8 = 0xffffffff;
    kinmem = (KINMem)0x0;
    iVar9 = -1;
    iVar7 = 0x1fb;
  }
  else if (*(int *)((long)kinmem + 0x2a8) == 0) {
    pcVar11 = "KINSol";
    pcVar15 = "Attempt to call before KINMalloc illegal.";
    uVar8 = 0xfffffffd;
    iVar9 = -3;
    iVar7 = 0x204;
  }
  else {
    *(N_Vector *)((long)kinmem + 0x108) = u;
    *(N_Vector *)((long)kinmem + 0x128) = u_scale;
    *(N_Vector *)((long)kinmem + 0x130) = f_scale;
    *(int *)((long)kinmem + 0x30) = strategy_in;
    if (strategy_in == 3) {
      if (u == (N_Vector)0x0) {
        pcVar11 = "KINSol";
        pcVar15 = "uu = NULL illegal.";
        uVar8 = 0xfffffffe;
        iVar9 = -2;
        iVar7 = 0x218;
      }
      else if (*(int *)((long)kinmem + 0x60) == 0) {
        KINPrintInfo((KINMem)kinmem,3,(char *)CONCAT44(in_register_00000014,strategy_in),
                     (char *)u_scale,"scsteptol = %12.3lg, fnormtol = %12.3lg",
                     *(undefined8 *)((long)kinmem + 0x28),*(undefined8 *)((long)kinmem + 0x20));
        *(undefined8 *)((long)kinmem + 0xe8) = 0;
        *(undefined8 *)((long)kinmem + 0xf0) = 0;
        *(undefined8 *)((long)kinmem + 0xd8) = 0;
        *(undefined8 *)((long)kinmem + 0xe0) = 0;
        *(undefined8 *)((long)kinmem + 0xf8) = 0;
        p_Var17 = *(N_Vector *)((long)kinmem + 0x148);
        *(undefined8 *)((long)kinmem + 0xd0) = 1;
        pKVar14 = *(KINMem *)((long)kinmem + 0x108);
        iVar7 = (**(code **)((long)kinmem + 0x10))
                          (pKVar14,*(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x18));
        *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
        pcVar11 = extraout_RDX_00;
        if (-1 < iVar7) {
          pdVar1 = (double *)((long)kinmem + 0x168);
          do {
            if (*(long *)((long)kinmem + 0x1b8) != 0) {
              uVar10 = *(ulong *)((long)kinmem + 0x1c0);
              if (*(long *)((long)kinmem + 0xd0) <= (long)uVar10) goto LAB_00109efa;
              if ((long)uVar10 < 1) {
                uVar10 = 0;
              }
              lVar13 = *(long *)((long)kinmem + 0xd0) + ~uVar10;
              u_scale = *(N_Vector *)((long)kinmem + 0x110);
              psVar32 = *(sunrealtype **)((long)kinmem + 0x1a8);
              pKVar14 = (KINMem)kinmem;
              uVar8 = AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),p_Var17,u_scale
                                  ,*(N_Vector *)((long)kinmem + 0x108),lVar13,psVar32,
                                  *(sunrealtype **)((long)kinmem + 0x1a0));
              if (uVar8 == 0) {
                dVar25 = 1.0;
                if ((lVar13 == 0) &&
                   ((*(int *)((long)kinmem + 0x1f8) != 0 ||
                    (dVar25 = 1.0, *(long *)((long)kinmem + 0x1d0) != 0)))) {
                  dVar25 = *pdVar1;
                }
                goto LAB_00109fa8;
              }
              p_Var17 = (N_Vector)(ulong)uVar8;
              pcVar11 = extraout_RDX_01;
LAB_0010a28d:
              iVar7 = (int)p_Var17;
              KINPrintInfo(pKVar14,1,pcVar11,(char *)u_scale,"Return value: %d",p_Var17,psVar32);
              if (iVar7 != -6) {
                if (iVar7 != -0xd) {
                  return iVar7;
                }
                goto LAB_0010a0f0;
              }
              pcVar11 = "KINSol";
              pcVar15 = "The maximum number of iterations was reached before convergence.";
              uVar8 = 0xfffffffa;
              iVar9 = -6;
              iVar7 = 0x236;
              goto LAB_0010a4cb;
            }
LAB_00109efa:
            pcVar2 = *(code **)((long)kinmem + 0x1d0);
            if (*(int *)((long)kinmem + 0x164) == 0) {
              if (pcVar2 != (code *)0x0) goto LAB_00109f20;
              N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x110));
              dVar25 = 1.0;
            }
            else {
              if (pcVar2 != (code *)0x0) {
LAB_00109f20:
                u_scale = (N_Vector)0x0;
                psVar32 = pdVar1;
                iVar7 = (*pcVar2)(*(undefined8 *)((long)kinmem + 0xd0),
                                  *(undefined8 *)((long)kinmem + 0x108),
                                  *(undefined8 *)((long)kinmem + 0x118),0,0,
                                  *(undefined8 *)((long)kinmem + 0x18),pdVar1);
                if (iVar7 == 0) {
                  dVar25 = *pdVar1;
                  if ((0.0 < dVar25) && (dVar25 <= 1.0)) goto LAB_00109f72;
                  pcVar15 = "The damping parameter is outside of the range (0, 1].";
                  iVar7 = 0xb45;
                }
                else {
                  pcVar15 = "The damping function failed.";
                  iVar7 = 0xb3e;
                }
                pcVar11 = "KINFP";
                KINProcessError((KINMem)kinmem,-0x12,iVar7,"KINFP",
                                "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                                ,pcVar15);
                iVar7 = -0x12;
                p_Var16 = (N_Vector)0xffffffee;
                pcVar15 = extraout_RDX_05;
                pKVar14 = (KINMem)kinmem;
                goto LAB_0010a27e;
              }
              dVar25 = *pdVar1;
LAB_00109f72:
              N_VLinearSum(1.0 - dVar25,*(undefined8 *)((long)kinmem + 0x108),
                           *(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x110));
              dVar25 = *(double *)((long)kinmem + 0x168);
            }
LAB_00109fa8:
            N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110)
                         ,*(undefined8 *)((long)kinmem + 0x108),p_Var17);
            N_VProd(*(undefined8 *)((long)kinmem + 0x130),p_Var17,
                    *(undefined8 *)((long)kinmem + 0x148));
            pKVar14 = *(KINMem *)((long)kinmem + 0x148);
            uVar19 = N_VMaxNorm();
            *(undefined8 *)((long)kinmem + 0x260) = uVar19;
            KINPrintInfo(pKVar14,4,module,(char *)u_scale,"scaled f norm (for stopping) = %12.3lg");
            psVar32 = *(sunrealtype **)((long)kinmem + 0xd8);
            KINPrintInfo(pKVar14,2,module_00,(char *)u_scale,
                         "nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
                         *(undefined8 *)((long)kinmem + 0x260),*(undefined8 *)((long)kinmem + 0xd0),
                         psVar32);
            u_scale = *(N_Vector *)((long)kinmem + 0xd0);
            dVar25 = dVar25 * *(double *)((long)kinmem + 0x20);
            if ((*(double *)((long)kinmem + 0x260) <= dVar25) ||
               (*(long *)((long)kinmem + 0x38) <= (long)u_scale)) {
              bVar18 = (long)u_scale < *(long *)((long)kinmem + 0x38);
              u_scale = (N_Vector)0xfffffffa;
              if (bVar18) {
                u_scale = (N_Vector)0xfffffc19;
              }
              p_Var17 = (N_Vector)0x0;
              if (dVar25 < *(double *)((long)kinmem + 0x260)) {
                p_Var17 = u_scale;
              }
              pcVar11 = extraout_RDX_02;
              if (*(int *)((long)kinmem + 0x160) != 0) {
                pKVar14 = *(KINMem *)((long)kinmem + 0x110);
                N_VScale(0x3ff0000000000000,pKVar14,*(undefined8 *)((long)kinmem + 0x108));
                pcVar11 = extraout_RDX_04;
              }
              goto LAB_0010a28d;
            }
            N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
                     *(undefined8 *)((long)kinmem + 0x108));
            *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
            pKVar14 = *(KINMem *)((long)kinmem + 0x108);
            iVar7 = (**(code **)((long)kinmem + 0x10))
                              (pKVar14,*(undefined8 *)((long)kinmem + 0x118),
                               *(undefined8 *)((long)kinmem + 0x18));
            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
            pcVar11 = extraout_RDX_03;
          } while (-1 < iVar7);
        }
        KINPrintInfo(pKVar14,1,pcVar11,(char *)u_scale,"Return value: %d",0xfffffff3);
LAB_0010a0f0:
        pcVar11 = "KINSol";
        pcVar15 = "The system function failed in an unrecoverable manner.";
        uVar8 = 0xfffffff3;
        iVar9 = -0xd;
        iVar7 = 0x232;
      }
      else {
        pcVar11 = "KINSol";
        pcVar15 = "Constraints not allowed with fixed point or Picard iterations";
        uVar8 = 0xfffffffe;
        iVar9 = -2;
        iVar7 = 0x220;
      }
    }
    else if (u == (N_Vector)0x0) {
      pcVar11 = "KINSolInit";
      pcVar15 = "uu = NULL illegal.";
      uVar8 = 0xfffffffe;
      iVar9 = -2;
      iVar7 = 0x584;
    }
    else if ((uint)strategy_in < 4) {
      if (u_scale == (N_Vector)0x0) {
        pcVar11 = "KINSolInit";
        pcVar15 = "uscale = NULL illegal.";
        uVar8 = 0xfffffffe;
        iVar9 = -2;
        iVar7 = 0x597;
      }
      else {
        dVar25 = (double)N_VMin(u_scale);
        if (dVar25 <= 0.0) {
          pcVar11 = "KINSolInit";
          pcVar15 = "uscale has nonpositive elements.";
          uVar8 = 0xfffffffe;
          iVar9 = -2;
          iVar7 = 0x59e;
        }
        else if (*(long *)((long)kinmem + 0x130) == 0) {
          pcVar11 = "KINSolInit";
          pcVar15 = "fscale = NULL illegal.";
          uVar8 = 0xfffffffe;
          iVar9 = -2;
          iVar7 = 0x5a5;
        }
        else {
          dVar25 = (double)N_VMin();
          if (dVar25 <= 0.0) {
            pcVar11 = "KINSolInit";
            pcVar15 = "fscale has nonpositive elements.";
            uVar8 = 0xfffffffe;
            iVar9 = -2;
            iVar7 = 0x5ac;
          }
          else {
            pKVar14 = *(KINMem *)((long)kinmem + 0x140);
            if (pKVar14 == (KINMem)0x0) {
              *(undefined4 *)((long)kinmem + 0x60) = 0;
              pcVar11 = extraout_RDX;
LAB_0010a2ec:
              KINPrintInfo(pKVar14,3,pcVar11,(char *)u_scale,
                           "scsteptol = %12.3lg, fnormtol = %12.3lg",
                           *(undefined8 *)((long)kinmem + 0x28));
              dVar25 = *(double *)((long)kinmem + 0x80);
              if ((dVar25 == 0.0) && (!NAN(dVar25))) {
                dVar25 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x108),
                                            *(undefined8 *)((long)kinmem + 0x128));
                dVar25 = dVar25 * 1000.0;
              }
              dVar21 = 1.0;
              if (1.0 <= dVar25) {
                dVar21 = dVar25;
              }
              *(double *)((long)kinmem + 0x78) = dVar21;
              if (*(int *)((long)kinmem + 0x250) == 0) {
                *(undefined4 *)((long)kinmem + 0x68) = 0;
              }
              else {
                bVar18 = *(int *)((long)kinmem + 0x58) != 3;
                u_scale = (N_Vector)(ulong)bVar18;
                *(uint *)((long)kinmem + 0x68) = (uint)bVar18;
                if (bVar18) {
                  if (*(int *)((long)kinmem + 0x58) == 1) {
                    *(undefined8 *)((long)kinmem + 0xb8) = 0x3ff9e3779b97f4a8;
                  }
                  *(undefined8 *)((long)kinmem + 0xa8) = 0x3fe0000000000000;
                }
                *(undefined4 *)((long)kinmem + 0x6c) = 1;
              }
              *(undefined8 *)((long)kinmem + 0xf0) = 0;
              *(undefined8 *)((long)kinmem + 0xf8) = 0;
              *(undefined8 *)((long)kinmem + 0xe0) = 0;
              *(undefined8 *)((long)kinmem + 0xe8) = 0;
              *(undefined8 *)((long)kinmem + 0xd0) = 0;
              *(undefined8 *)((long)kinmem + 0xd8) = 0;
              iVar7 = (**(code **)((long)kinmem + 0x10))
                                (*(undefined8 *)((long)kinmem + 0x108),
                                 *(undefined8 *)((long)kinmem + 0x118),
                                 *(undefined8 *)((long)kinmem + 0x18));
              *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
              if (iVar7 < 0) {
                pcVar11 = "KINSolInit";
                pcVar15 = "The system function failed in an unrecoverable manner.";
                uVar8 = 0xfffffff3;
                iVar9 = -0xd;
                iVar7 = 0x610;
              }
              else if (iVar7 == 0) {
                pKVar14 = (KINMem)kinmem;
                sVar20 = KINScFNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x118),
                                    *(N_Vector *)((long)kinmem + 0x130));
                if (sVar20 <= *(double *)((long)kinmem + 0x20) * 0.01) {
                  uVar19 = N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                      *(undefined8 *)((long)kinmem + 0x130));
                  *(undefined8 *)((long)kinmem + 0x260) = uVar19;
                  return 1;
                }
                KINPrintInfo(pKVar14,4,module_01,(char *)u_scale,
                             "scaled f norm (for stopping) = %12.3lg");
                if ((*(code **)((long)kinmem + 0x230) == (code *)0x0) ||
                   (iVar7 = (**(code **)((long)kinmem + 0x230))(kinmem), iVar7 == 0)) {
                  pKVar14 = *(KINMem *)((long)kinmem + 0x118);
                  dVar25 = (double)N_VWL2Norm(pKVar14,*(undefined8 *)((long)kinmem + 0x130));
                  *(double *)((long)kinmem + 0x260) = dVar25;
                  *(double *)((long)kinmem + 0x268) = dVar25 * 0.5 * dVar25;
                  *(double *)((long)kinmem + 0x280) = dVar25;
                  psVar32 = *(sunrealtype **)((long)kinmem + 0xd8);
                  KINPrintInfo(pKVar14,2,module_02,(char *)u_scale,
                               "nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
                               *(undefined8 *)((long)kinmem + 0xd0),psVar32);
                  *(undefined8 *)((long)kinmem + 0x100) = 0;
                  *(undefined8 *)((long)kinmem + 200) =
                       *(undefined8 *)
                        (&DAT_0011b050 + (ulong)(*(int *)((long)kinmem + 0xc0) == 0) * 8);
                  iVar7 = *(int *)((long)kinmem + 0x250);
                  dVar25 = 0.0;
                  if ((iVar7 != 0) && (*(int *)((long)kinmem + 0x5c) == 0)) {
                    dVar25 = *(double *)((long)kinmem + 0x20) * 0.01;
                  }
                  uVar8 = -(uint)(*(double *)((long)kinmem + 0x290) == 0.0) & 1;
                  pcVar11 = (char *)(ulong)uVar8;
                  *(uint *)((long)kinmem + 0x288) = uVar8;
                  if (*(int *)((long)kinmem + 0x30) != 2) {
                    bVar18 = false;
                    local_e8 = -1.0;
                    local_c8._8_8_ = local_c8._0_8_;
                    local_c8._0_8_ = 0xbff0000000000000;
                    uVar12 = 0;
LAB_0010aad8:
                    *(undefined4 *)((long)kinmem + 0x70) = 0;
                    *(long *)((long)kinmem + 0xd0) = *(long *)((long)kinmem + 0xd0) + 1;
                    if (*(int *)((long)kinmem + 0x250) != 0) {
                      dVar21 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8)) *
                               *(double *)((long)kinmem + 0x260);
                      *(double *)((long)kinmem + 0xa0) = dVar21;
                      if (*(int *)((long)kinmem + 0x5c) == 0) {
                        dVar31 = dVar25;
                        if (dVar25 <= dVar21) {
                          dVar31 = dVar21;
                        }
                        *(double *)((long)kinmem + 0xa0) = dVar31;
                      }
                    }
LAB_0010ab27:
                    pKVar14 = (KINMem)kinmem;
                    if (*(int *)((long)kinmem + 0x30) == 1) {
                      uVar8 = KINLinSolDrv((KINMem)kinmem);
                      pcVar15 = extraout_RDX_17;
                      if (uVar8 == 0) {
                        local_f0 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x138),
                                                      *(undefined8 *)((long)kinmem + 0x128));
                        dVar21 = *(double *)((long)kinmem + 0x78) / local_f0;
                        *(double *)((long)kinmem + 0x90) = local_f0;
                        if (local_f0 <= *(double *)((long)kinmem + 0x78)) {
                          local_b8 = 1.0;
                          local_e0 = dVar21;
                        }
                        else {
                          N_VScale(dVar21,*(undefined8 *)((long)kinmem + 0x138),
                                   *(undefined8 *)((long)kinmem + 0x138));
                          local_f0 = *(double *)((long)kinmem + 0x78);
                          *(double *)((long)kinmem + 0x90) = local_f0;
                          local_e0 = 1.0;
                          local_b8 = dVar21;
                        }
                        *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
                        if ((*(int *)((long)kinmem + 0x60) == 0) ||
                           (iVar7 = KINConstraint((KINMem)kinmem), iVar7 != -0x3e4)) {
LAB_0010ae5c:
                          iVar7 = 5;
                          while( true ) {
                            N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                         *(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar14 = *(KINMem *)((long)kinmem + 0x110);
                            iVar9 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar14,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            if (iVar9 == 0) break;
                            pcVar15 = extraout_RDX_18;
                            if (iVar9 < 0) goto LAB_0010bc0d;
                            pKVar14 = *(KINMem *)((long)kinmem + 0x138);
                            N_VScale(0x3fe0000000000000,pKVar14,pKVar14);
                            local_b8 = local_b8 * 0.5;
                            local_f0 = local_f0 * 0.5;
                            *(double *)((long)kinmem + 0x90) = local_f0;
                            local_e0 = 1.0;
                            iVar7 = iVar7 + -1;
                            pcVar15 = extraout_RDX_19;
                            if (iVar7 == 0) goto LAB_0010bc53;
                          }
                          local_e8 = (double)N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                                        *(undefined8 *)((long)kinmem + 0x130));
                          dVar22 = *(double *)((long)kinmem + 0x270) * local_b8;
                          pKVar14 = (KINMem)kinmem;
                          sVar20 = KINScSNorm((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x138),
                                              *(N_Vector *)((long)kinmem + 0x108));
                          dVar21 = *(double *)((long)kinmem + 0x28) / sVar20;
                          KINPrintInfo(pKVar14,8,module_07,pcVar11,
                                       "min_lam = %11.4le, f1norm = %11.4le, pnorm = %11.4le",dVar21
                                       ,*(undefined8 *)((long)kinmem + 0x268),SUB84(local_f0,0));
                          uVar28 = 0;
                          uVar29 = 0;
                          dVar24 = dVar22 * 0.0001;
                          iVar7 = 0;
                          local_a8 = 0.0;
                          local_88 = 0.0;
                          bVar18 = false;
                          pcVar15 = extraout_RDX_20;
                          dVar31 = 1.0;
                          local_c8._0_8_ = local_e8 * 0.5 * local_e8;
                          do {
                            dVar27 = (double)local_c8._0_8_;
                            local_d8 = dVar31;
                            local_c8._8_4_ = uVar28;
                            local_c8._0_8_ = dVar27;
                            local_c8._12_4_ = uVar29;
                            dVar23 = dVar24 * local_d8 + *(double *)((long)kinmem + 0x268);
                            KINPrintInfo(pKVar14,9,pcVar15,pcVar11,
                                         "fnorm = %15.8le, f1norm = %15.8le, alpha_cond = %15.8le,lam = %15.8le"
                                        );
                            dVar31 = *(double *)((long)kinmem + 0x268);
                            if (dVar27 <= dVar23) {
                              dVar22 = dVar22 * 0.9;
                              pcVar15 = extraout_RDX_21;
                              if (dVar22 * local_d8 + dVar31 <= dVar27) goto LAB_0010b877;
                              if ((local_d8 != 1.0) || (NAN(local_d8))) goto LAB_0010b5fb;
                              if (local_f0 < *(double *)((long)kinmem + 0x78)) {
                                local_88 = 1.0;
                                goto LAB_0010b4ad;
                              }
                              local_d8 = 1.0;
                              goto LAB_0010b893;
                            }
                            if (bVar18) {
                              dVar26 = (dVar27 - dVar31) - local_d8 * dVar22;
                              dVar31 = (local_88 - dVar31) - local_a8 * dVar22;
                              dVar30 = 1.0 / (local_d8 - local_a8);
                              dVar23 = ((1.0 / (local_d8 * local_d8)) * dVar26 +
                                       (-1.0 / (local_a8 * local_a8)) * dVar31) * dVar30;
                              dVar30 = dVar30 * ((local_d8 / (local_a8 * local_a8)) * dVar31 -
                                                (local_a8 / (local_d8 * local_d8)) * dVar26);
                              dVar31 = dVar23 * 3.0;
                              if (*(double *)((long)kinmem + 8) <= ABS(dVar23)) {
                                dVar26 = dVar30 * dVar30 - dVar22 * dVar31;
                                dVar23 = 0.0;
                                if (0.0 < dVar26) {
                                  if (dVar26 < 0.0) {
                                    dVar23 = sqrt(dVar26);
                                  }
                                  else {
                                    dVar23 = SQRT(dVar26);
                                  }
                                }
                                dVar31 = (dVar23 - dVar30) / dVar31;
                              }
                              else {
                                dVar31 = -dVar22 / (dVar30 + dVar30);
                              }
                            }
                            else {
                              dVar31 = (dVar27 - dVar31) - dVar22;
                              dVar31 = -dVar22 / (dVar31 + dVar31);
                            }
                            dVar23 = local_d8 * 0.5;
                            if (dVar31 <= local_d8 * 0.5) {
                              dVar23 = dVar31;
                            }
                            dVar31 = local_d8 * 0.1;
                            if (local_d8 * 0.1 <= dVar23) {
                              dVar31 = dVar23;
                            }
                            N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar14 = *(KINMem *)((long)kinmem + 0x110);
                            iVar9 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar14,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            pcVar15 = extraout_RDX_22;
                            if (iVar9 != 0) goto LAB_0010bc0d;
                            iVar7 = iVar7 + 1;
                            pKVar14 = *(KINMem *)((long)kinmem + 0x118);
                            local_e8 = (double)N_VWL2Norm(pKVar14,*(undefined8 *)
                                                                   ((long)kinmem + 0x130));
                            uVar28 = (undefined4)extraout_XMM0_Qb;
                            uVar29 = (undefined4)((ulong)extraout_XMM0_Qb >> 0x20);
                            local_c8._0_8_ = local_e8 * 0.5 * local_e8;
                            bVar18 = true;
                            pcVar15 = extraout_RDX_23;
                            local_a8 = local_d8;
                            local_88 = dVar27;
                          } while (dVar21 <= dVar31);
                          pKVar14 = *(KINMem *)((long)kinmem + 0x108);
                          N_VScale(0x3ff0000000000000,pKVar14,*(undefined8 *)((long)kinmem + 0x110))
                          ;
                          pcVar15 = extraout_RDX_24;
                        }
                        else {
                          pKVar14 = *(KINMem *)((long)kinmem + 0x138);
                          N_VScale(*(undefined8 *)((long)kinmem + 0x98),pKVar14,pKVar14);
                          dVar21 = *(double *)((long)kinmem + 0x98);
                          local_f0 = local_f0 * dVar21;
                          *(double *)((long)kinmem + 0x90) = local_f0;
                          KINPrintInfo(pKVar14,6,module_06,pcVar11,"(ivio=1) pnorm = %12.4le");
                          if (*(double *)((long)kinmem + 0x28) < local_f0) {
                            local_b8 = local_b8 * dVar21;
                            local_e0 = 1.0;
                            goto LAB_0010ae5c;
                          }
                          pKVar14 = *(KINMem *)((long)kinmem + 0x108);
                          N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,pKVar14,
                                       *(undefined8 *)((long)kinmem + 0x138),
                                       *(undefined8 *)((long)kinmem + 0x110));
                          pcVar15 = extraout_RDX_25;
                        }
                        iVar7 = -0x3e5;
                        goto LAB_0010b3a5;
                      }
                    }
                    else {
                      if (*(int *)((long)kinmem + 0x30) != 0) {
LAB_0010b3c0:
                        iVar7 = 0;
                        goto LAB_0010b3c3;
                      }
                      uVar8 = KINLinSolDrv((KINMem)kinmem);
                      pcVar15 = extraout_RDX_12;
                      if (uVar8 == 0) {
                        pKVar14 = *(KINMem *)((long)kinmem + 0x138);
                        local_f0 = (double)N_VWL2Norm(pKVar14,*(undefined8 *)((long)kinmem + 0x128))
                        ;
                        local_b8 = 1.0;
                        pcVar15 = extraout_RDX_13;
                        if (*(double *)((long)kinmem + 0x78) < local_f0) {
                          local_b8 = *(double *)((long)kinmem + 0x78) / local_f0;
                          pKVar14 = *(KINMem *)((long)kinmem + 0x138);
                          N_VScale(pKVar14,pKVar14);
                          local_f0 = *(double *)((long)kinmem + 0x78);
                          pcVar15 = extraout_RDX_14;
                        }
                        KINPrintInfo(pKVar14,5,pcVar15,pcVar11,"pnorm = %12.4le",local_f0);
                        *(double *)((long)kinmem + 0x90) = local_f0;
                        *(undefined8 *)((long)kinmem + 0x98) = 0x3ff0000000000000;
                        if ((*(int *)((long)kinmem + 0x60) == 0) ||
                           (iVar7 = KINConstraint((KINMem)kinmem), iVar7 != -0x3e4)) {
LAB_0010ac6b:
                          iVar7 = 5;
                          while( true ) {
                            N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                         *(undefined8 *)((long)kinmem + 0x108),
                                         *(undefined8 *)((long)kinmem + 0x138),
                                         *(undefined8 *)((long)kinmem + 0x110));
                            pKVar14 = *(KINMem *)((long)kinmem + 0x110);
                            iVar9 = (**(code **)((long)kinmem + 0x10))
                                              (pKVar14,*(undefined8 *)((long)kinmem + 0x118),
                                               *(undefined8 *)((long)kinmem + 0x18));
                            *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                            if (iVar9 == 0) break;
                            pcVar15 = extraout_RDX_15;
                            if (iVar9 < 0) goto LAB_0010bc0d;
                            local_b8 = local_b8 * 0.5;
                            pKVar14 = *(KINMem *)((long)kinmem + 0x138);
                            N_VScale(0x3fe0000000000000,pKVar14,pKVar14);
                            local_f0 = local_f0 * 0.5;
                            *(double *)((long)kinmem + 0x90) = local_f0;
                            iVar7 = iVar7 + -1;
                            pcVar15 = extraout_RDX_16;
                            if (iVar7 == 0) goto LAB_0010bc53;
                          }
                          pKVar14 = *(KINMem *)((long)kinmem + 0x118);
                          local_e8 = (double)N_VWL2Norm(pKVar14,*(undefined8 *)
                                                                 ((long)kinmem + 0x130));
                          local_c8._0_8_ = local_e8 * 0.5 * local_e8;
                          dVar21 = local_b8 * *(double *)((long)kinmem + 0x278);
                          auVar6._8_4_ = SUB84(dVar21,0);
                          auVar6._0_8_ = local_b8 * *(double *)((long)kinmem + 0x270);
                          auVar6._12_4_ = (int)((ulong)dVar21 >> 0x20);
                          *(undefined1 (*) [16])((long)kinmem + 0x270) = auVar6;
                          KINPrintInfo(pKVar14,7,module_08,pcVar11,"fnorm(L2) = %20.8le");
                          uVar12 = 0;
                          if (local_f0 <= *(double *)((long)kinmem + 0x78) * 0.99) {
                            bVar18 = false;
                          }
                          else {
                            bVar18 = true;
                            uVar12 = 0;
                          }
                          goto LAB_0010b3c0;
                        }
                        dVar21 = *(double *)((long)kinmem + 0x98);
                        pKVar14 = *(KINMem *)((long)kinmem + 0x138);
                        N_VScale(pKVar14,pKVar14);
                        local_f0 = local_f0 * *(double *)((long)kinmem + 0x98);
                        *(double *)((long)kinmem + 0x90) = local_f0;
                        KINPrintInfo(pKVar14,5,module_05,pcVar11,"pnorm = %12.4le");
                        if (*(double *)((long)kinmem + 0x28) < local_f0) {
                          local_b8 = local_b8 * dVar21;
                          goto LAB_0010ac6b;
                        }
                        N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,
                                     *(undefined8 *)((long)kinmem + 0x108),
                                     *(undefined8 *)((long)kinmem + 0x138),
                                     *(undefined8 *)((long)kinmem + 0x110));
                        iVar7 = -0x3e5;
                        bVar18 = false;
                        goto LAB_0010b3b9;
                      }
                    }
                    goto LAB_0010bcf4;
                  }
                  if (*(long *)((long)kinmem + 0x120) != 0) {
LAB_0010a6a9:
                    local_98 = 0.0;
                    if ((iVar7 != 0) && (local_98 = 0.0, *(int *)((long)kinmem + 0x5c) == 0)) {
                      local_98 = *(double *)((long)kinmem + 0x20) * 0.01;
                    }
                    p_Var17 = *(N_Vector *)((long)kinmem + 0x148);
                    pdVar1 = (double *)((long)kinmem + 0x168);
                    lVar13 = 0;
                    do {
                      *(long *)((long)kinmem + 0xd0) = lVar13 + 1;
                      if (iVar7 != 0) {
                        dVar25 = (*(double *)((long)kinmem + 0xa8) + *(double *)((long)kinmem + 8))
                                 * *(double *)((long)kinmem + 0x260);
                        *(double *)((long)kinmem + 0xa0) = dVar25;
                        if (*(int *)((long)kinmem + 0x5c) == 0) {
                          dVar21 = local_98;
                          if (local_98 <= dVar25) {
                            dVar21 = dVar25;
                          }
                          *(double *)((long)kinmem + 0xa0) = dVar21;
                        }
                      }
                      uVar19 = *(undefined8 *)((long)kinmem + 0x120);
                      uVar3 = *(undefined8 *)((long)kinmem + 0x108);
                      uVar4 = *(undefined8 *)((long)kinmem + 0x118);
                      if (*(long *)((long)kinmem + 0x40) <=
                          (lVar13 + 1) - *(long *)((long)kinmem + 0xe0)) {
                        *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
                        *(undefined4 *)((long)kinmem + 0x74) = 1;
                        *(undefined4 *)((long)kinmem + 100) = 0;
                        goto LAB_0010a7a8;
                      }
                      *(undefined4 *)((long)kinmem + 100) = 0;
                      if (1.5 < *(double *)((long)kinmem + 200)) goto LAB_0010a7a8;
                      while( true ) {
                        N_VScale(0xbff0000000000000,uVar4,uVar4);
                        pcVar11 = (char *)((long)kinmem + 0x278);
                        pKVar14 = (KINMem)kinmem;
                        iVar7 = (**(code **)((long)kinmem + 0x240))
                                          (kinmem,uVar19,uVar4,(N_Vector)((long)kinmem + 0x278),
                                           (long)kinmem + 0x270);
                        if (iVar7 == 0) break;
                        p_Var16 = (N_Vector)0xfffffff3;
                        pcVar15 = extraout_RDX_08;
                        if (((iVar7 < 0) || (*(long *)((long)kinmem + 0x238) == 0)) ||
                           (*(int *)((long)kinmem + 100) != 0)) goto LAB_0010bdb2;
                        *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
LAB_0010a7a8:
                        if (*(code **)((long)kinmem + 0x238) != (code *)0x0) {
                          pKVar14 = (KINMem)kinmem;
                          iVar7 = (**(code **)((long)kinmem + 0x238))();
                          *(undefined4 *)((long)kinmem + 100) = 1;
                          pcVar11 = *(char **)((long)kinmem + 0xd0);
                          *(char **)((long)kinmem + 0xe0) = pcVar11;
                          *(char **)((long)kinmem + 0xe8) = pcVar11;
                          pcVar15 = extraout_RDX_07;
                          if (iVar7 != 0) goto LAB_0010bc99;
                        }
                      }
                      N_VLinearSum(0x3ff0000000000000,0x3ff0000000000000,uVar3,uVar19,uVar19);
                      if (*(long *)((long)kinmem + 0x1b8) == 0) {
LAB_0010a8d6:
                        pcVar2 = *(code **)((long)kinmem + 0x1d0);
                        if (*(int *)((long)kinmem + 0x164) == 0) {
                          if (pcVar2 != (code *)0x0) goto LAB_0010a900;
                          N_VScale(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x120),
                                   *(undefined8 *)((long)kinmem + 0x110));
                        }
                        else {
                          if (pcVar2 != (code *)0x0) {
LAB_0010a900:
                            pcVar11 = (char *)0x0;
                            psVar32 = pdVar1;
                            iVar7 = (*pcVar2)(*(undefined8 *)((long)kinmem + 0xd0),
                                              *(undefined8 *)((long)kinmem + 0x108),
                                              *(undefined8 *)((long)kinmem + 0x118),0,0,
                                              *(undefined8 *)((long)kinmem + 0x18),pdVar1);
                            if (iVar7 == 0) {
                              dVar25 = *pdVar1;
                              if ((0.0 < dVar25) && (dVar25 <= 1.0)) goto LAB_0010a94d;
                              pcVar15 = "The damping parameter is outside of the range (0, 1].";
                              iVar7 = 0xa6d;
                            }
                            else {
                              pcVar15 = "The damping function failed.";
                              iVar7 = 0xa66;
                            }
                            pcVar11 = "KINPicardAA";
                            KINProcessError((KINMem)kinmem,-0x12,iVar7,"KINPicardAA",
                                            "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                                            ,pcVar15);
                            pcVar15 = extraout_RDX_34;
                            pKVar14 = (KINMem)kinmem;
                            p_Var16 = (N_Vector)0xffffffee;
                            goto LAB_0010bdb2;
                          }
                          dVar25 = *pdVar1;
LAB_0010a94d:
                          N_VLinearSum(1.0 - dVar25,*(undefined8 *)((long)kinmem + 0x108),
                                       *(undefined8 *)((long)kinmem + 0x120),
                                       *(undefined8 *)((long)kinmem + 0x110));
                        }
                      }
                      else {
                        uVar10 = *(ulong *)((long)kinmem + 0x1c0);
                        if (*(long *)((long)kinmem + 0xd0) <= (long)uVar10) goto LAB_0010a8d6;
                        if ((long)uVar10 < 1) {
                          uVar10 = 0;
                        }
                        pcVar11 = *(char **)((long)kinmem + 0x110);
                        psVar32 = *(sunrealtype **)((long)kinmem + 0x1a8);
                        pKVar14 = (KINMem)kinmem;
                        uVar8 = AndersonAcc((KINMem)kinmem,*(N_Vector *)((long)kinmem + 0x120),
                                            p_Var17,(N_Vector)pcVar11,
                                            *(N_Vector *)((long)kinmem + 0x108),
                                            *(long *)((long)kinmem + 0xd0) + ~uVar10,psVar32,
                                            *(sunrealtype **)((long)kinmem + 0x1a0));
                        if (uVar8 != 0) {
                          pcVar15 = extraout_RDX_09;
                          p_Var16 = (N_Vector)(ulong)uVar8;
                          goto LAB_0010bdb2;
                        }
                      }
                      pKVar14 = *(KINMem *)((long)kinmem + 0x110);
                      iVar7 = (**(code **)((long)kinmem + 0x10))
                                        (pKVar14,*(undefined8 *)((long)kinmem + 0x118),
                                         *(undefined8 *)((long)kinmem + 0x18));
                      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
                      pcVar15 = extraout_RDX_10;
                      if (iVar7 < 0) {
LAB_0010bc99:
                        p_Var16 = (N_Vector)0xfffffff3;
                        goto LAB_0010bdb2;
                      }
                      N_VProd(*(undefined8 *)((long)kinmem + 0x130),
                              *(undefined8 *)((long)kinmem + 0x118),
                              *(undefined8 *)((long)kinmem + 0x148));
                      pKVar14 = *(KINMem *)((long)kinmem + 0x148);
                      uVar19 = N_VMaxNorm();
                      *(undefined8 *)((long)kinmem + 0x260) = uVar19;
                      KINPrintInfo(pKVar14,4,module_03,pcVar11,
                                   "scaled f norm (for stopping) = %12.3lg");
                      psVar32 = *(sunrealtype **)((long)kinmem + 0xd8);
                      KINPrintInfo(pKVar14,2,module_04,pcVar11,
                                   "nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
                                   *(undefined8 *)((long)kinmem + 0x260),
                                   *(undefined8 *)((long)kinmem + 0xd0),psVar32);
                      lVar13 = *(long *)((long)kinmem + 0xd0);
                      lVar5 = *(long *)((long)kinmem + 0x38);
                      dVar25 = *(double *)((long)kinmem + 0x260);
                      dVar21 = *(double *)((long)kinmem + 0x20);
                      pKVar14 = *(KINMem *)((long)kinmem + 0x110);
                      N_VScale(0x3ff0000000000000,pKVar14,*(undefined8 *)((long)kinmem + 0x108));
                      if ((dVar25 <= dVar21) || (lVar5 <= lVar13)) goto LAB_0010bcd1;
                      if (*(int *)((long)kinmem + 0x68) != 0) {
                        sVar20 = (sunrealtype)
                                 N_VWL2Norm(*(undefined8 *)((long)kinmem + 0x118),
                                            *(undefined8 *)((long)kinmem + 0x130));
                        KINForcingTerm((KINMem)kinmem,sVar20);
                      }
                      lVar13 = *(long *)((long)kinmem + 0xd0);
                      iVar7 = *(int *)((long)kinmem + 0x250);
                    } while( true );
                  }
                  lVar13 = N_VClone(*(undefined8 *)((long)kinmem + 0x110));
                  *(long *)((long)kinmem + 0x120) = lVar13;
                  if (lVar13 != 0) {
                    *(long *)((long)kinmem + 0x220) =
                         *(long *)((long)kinmem + 0x220) + *(long *)((long)kinmem + 0x210);
                    *(long *)((long)kinmem + 0x228) =
                         *(long *)((long)kinmem + 0x228) + *(long *)((long)kinmem + 0x218);
                    iVar7 = *(int *)((long)kinmem + 0x250);
                    goto LAB_0010a6a9;
                  }
                  pcVar11 = "KINSol";
                  pcVar15 = "A memory request failed.";
                  uVar8 = 0xfffffffc;
                  iVar9 = -4;
                  iVar7 = 0x268;
                }
                else {
                  pcVar11 = "KINSolInit";
                  pcVar15 = "The linear solver\'s init routine failed.";
                  uVar8 = 0xfffffff6;
                  iVar9 = -10;
                  iVar7 = 0x62d;
                }
              }
              else {
                pcVar11 = "KINSolInit";
                pcVar15 = "The system function failed at the first call.";
                uVar8 = 0xfffffff2;
                iVar9 = -0xe;
                iVar7 = 0x616;
              }
            }
            else if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) {
              pcVar11 = "KINSolInit";
              pcVar15 = "Constraints not allowed with fixed point or Picard iterations";
              uVar8 = 0xfffffffe;
              iVar9 = -2;
              iVar7 = 0x5b5;
            }
            else {
              *(undefined4 *)((long)kinmem + 0x60) = 1;
              if ((*(long *)((long)pKVar14->kin_uround + 0xe0) == 0) ||
                 (*(long *)((long)pKVar14->kin_uround + 0xe8) == 0)) {
                pcVar11 = "KINSolInit";
                pcVar15 = "A required vector operation is not implemented.";
                uVar8 = 0xfffffffe;
                iVar9 = -2;
                iVar7 = 0x5c6;
              }
              else {
                iVar7 = N_VConstrMask(pKVar14,*(undefined8 *)((long)kinmem + 0x108),
                                      *(undefined8 *)((long)kinmem + 0x148));
                pcVar11 = extraout_RDX_06;
                if (iVar7 != 0) goto LAB_0010a2ec;
                pcVar11 = "KINSolInit";
                pcVar15 = "Initial guess does NOT meet constraints.";
                uVar8 = 0xfffffffe;
                iVar9 = -2;
                iVar7 = 0x5d3;
              }
            }
          }
        }
      }
    }
    else {
      pcVar11 = "KINSolInit";
      pcVar15 = "Illegal value for global strategy.";
      uVar8 = 0xfffffffe;
      iVar9 = -2;
      iVar7 = 0x590;
    }
  }
  goto LAB_0010a4cb;
  while( true ) {
    iVar7 = iVar7 + 1;
    pKVar14 = *(KINMem *)((long)kinmem + 0x118);
    local_e8 = (double)N_VWL2Norm(pKVar14,*(undefined8 *)((long)kinmem + 0x130));
    dVar27 = local_e8 * 0.5 * local_e8;
    local_c8._8_8_ = extraout_XMM0_Qb_00;
    local_c8._0_8_ = dVar27;
    dVar31 = *(double *)((long)kinmem + 0x268);
    dVar23 = dVar24 * local_d8 + dVar31;
    KINPrintInfo(pKVar14,10,module_09,pcVar11,"f1norm = %15.8le, beta_cond = %15.8le, lam = %15.8le"
                 ,dVar27);
    bVar18 = dVar22 * local_d8 + dVar31 <= dVar27;
    if ((dVar23 < dVar27 || bVar18) || (local_e0 <= local_88)) break;
LAB_0010b4ad:
    local_a8 = local_88;
    local_88 = local_88 + local_88;
    local_d8 = local_88;
    if (local_e0 <= local_88) {
      local_d8 = local_e0;
    }
    N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                 *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
    pKVar14 = *(KINMem *)((long)kinmem + 0x110);
    iVar9 = (**(code **)((long)kinmem + 0x10))
                      (pKVar14,*(undefined8 *)((long)kinmem + 0x118),
                       *(undefined8 *)((long)kinmem + 0x18));
    *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
    pcVar15 = extraout_RDX_26;
    if (iVar9 != 0) goto LAB_0010bc0d;
  }
  pcVar15 = extraout_RDX_27;
  if (dVar23 >= dVar27 && !bVar18) {
    local_d8 = local_e0;
  }
LAB_0010b5fb:
  if ((local_d8 < 1.0) || ((1.0 < local_d8 && (dVar23 < dVar27)))) {
    uVar28 = SUB84(local_d8,0);
    uVar29 = (undefined4)((ulong)local_d8 >> 0x20);
    if (local_a8 <= local_d8) {
      uVar28 = SUB84(local_a8,0);
      uVar29 = (undefined4)((ulong)local_a8 >> 0x20);
    }
    local_88 = (double)CONCAT44(uVar29,uVar28);
    local_a8 = ABS(local_a8 - local_d8);
    do {
      local_e0 = local_a8;
      local_a8 = local_e0;
      do {
        local_e0 = local_a8;
        local_a8 = local_e0 * 0.5;
        local_d8 = local_88 + local_a8;
        N_VLinearSum(0x3ff0000000000000,*(undefined8 *)((long)kinmem + 0x108),
                     *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
        pKVar14 = *(KINMem *)((long)kinmem + 0x110);
        iVar9 = (**(code **)((long)kinmem + 0x10))
                          (pKVar14,*(undefined8 *)((long)kinmem + 0x118),
                           *(undefined8 *)((long)kinmem + 0x18));
        *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
        pcVar15 = extraout_RDX_28;
        if (iVar9 != 0) goto LAB_0010bc0d;
        iVar7 = iVar7 + 1;
        pKVar14 = *(KINMem *)((long)kinmem + 0x118);
        local_e8 = (double)N_VWL2Norm(pKVar14,*(undefined8 *)((long)kinmem + 0x130));
        dVar27 = local_e8 * 0.5 * local_e8;
        local_c8._0_8_ = dVar27;
        dVar31 = dVar24 * local_d8 + *(double *)((long)kinmem + 0x268);
        dVar23 = dVar22 * local_d8 + *(double *)((long)kinmem + 0x268);
        KINPrintInfo(pKVar14,0xb,module_10,pcVar11,
                     "f1norm = %15.8le, alpha_cond = %15.8le, beta_cond = %15.8le, lam = %15.8le",
                     dVar27,dVar31);
      } while (dVar31 < dVar27);
      if (dVar23 <= dVar27) break;
      local_a8 = local_e0 - local_a8;
      local_88 = (double)(~-(ulong)(dVar27 < dVar23) & (ulong)local_88 |
                         -(ulong)(dVar27 < dVar23) & (ulong)local_d8);
    } while (dVar21 <= local_a8);
    pcVar15 = extraout_RDX_29;
    if (dVar27 < dVar23) {
      N_VLinearSum(0x3ff0000000000000,local_d8,*(undefined8 *)((long)kinmem + 0x108),
                   *(undefined8 *)((long)kinmem + 0x138),*(undefined8 *)((long)kinmem + 0x110));
      pKVar14 = *(KINMem *)((long)kinmem + 0x110);
      iVar9 = (**(code **)((long)kinmem + 0x10))
                        (pKVar14,*(undefined8 *)((long)kinmem + 0x118),
                         *(undefined8 *)((long)kinmem + 0x18));
      *(long *)((long)kinmem + 0xd8) = *(long *)((long)kinmem + 0xd8) + 1;
      pcVar15 = extraout_RDX_30;
      if (iVar9 != 0) {
LAB_0010bc0d:
        KINPrintInfo(pKVar14,1,pcVar15,pcVar11,"Return value: %d",0xfffffff3);
        goto switchD_0010bd25_caseD_fffffff3;
      }
      pKVar14 = *(KINMem *)((long)kinmem + 0x118);
      local_e8 = (double)N_VWL2Norm(pKVar14,*(undefined8 *)((long)kinmem + 0x130));
      local_c8._0_8_ = local_e8 * 0.5 * local_e8;
      *(long *)((long)kinmem + 0xf0) = *(long *)((long)kinmem + 0xf0) + 1;
      pcVar15 = extraout_RDX_31;
    }
  }
  else {
LAB_0010b877:
    local_c8._0_8_ = dVar27;
  }
LAB_0010b893:
  *(long *)((long)kinmem + 0xf8) = *(long *)((long)kinmem + 0xf8) + (long)iVar7;
  iVar7 = 0;
  KINPrintInfo(pKVar14,0xc,pcVar15,pcVar11,"no. of lambda adjustments = %ld");
  *(double *)((long)kinmem + 0x270) = local_b8 * local_d8 * *(double *)((long)kinmem + 0x270);
  *(double *)((long)kinmem + 0x278) = local_b8 * local_d8 * *(double *)((long)kinmem + 0x278);
  pcVar15 = extraout_RDX_32;
  if (local_f0 * local_d8 <= *(double *)((long)kinmem + 0x78) * 0.99) {
LAB_0010b3a5:
    bVar18 = false;
  }
  else {
    bVar18 = true;
  }
  if (*(long *)((long)kinmem + 0x50) < *(long *)((long)kinmem + 0xf0)) {
    KINPrintInfo(pKVar14,1,pcVar15,pcVar11,"Return value: %d",0xfffffff8);
    goto switchD_0010bd25_caseD_fffffff8;
  }
LAB_0010b3b9:
  uVar12 = 0;
LAB_0010b3c3:
  uVar8 = uVar12;
  if ((*(uint *)((long)kinmem + 0x30) & 0xfffffffe) == 2) goto LAB_0010ba3b;
  if (*(int *)((long)kinmem + 0x68) != 0) {
    KINForcingTerm((KINMem)kinmem,local_e8);
  }
  *(double *)((long)kinmem + 0x260) = local_e8;
  if (iVar7 == -0x3e5) {
    if ((*(long *)((long)kinmem + 0x238) == 0) || (*(int *)((long)kinmem + 100) != 0))
    goto LAB_0010b90b;
    *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
    *(undefined4 *)((long)kinmem + 0x70) = 1;
    uVar12 = 0xfffffc1a;
    goto LAB_0010ab27;
  }
  N_VProd(*(undefined8 *)((long)kinmem + 0x130),*(undefined8 *)((long)kinmem + 0x118),
          *(undefined8 *)((long)kinmem + 0x148));
  pKVar14 = *(KINMem *)((long)kinmem + 0x148);
  dVar21 = (double)N_VMaxNorm();
  KINPrintInfo(pKVar14,4,module_11,pcVar11,"scaled f norm (for stopping) = %12.3lg");
  uVar8 = 0;
  if (dVar21 <= *(double *)((long)kinmem + 0x20)) goto LAB_0010ba3b;
  p_Var17 = *(N_Vector *)((long)kinmem + 0x138);
  N_VLinearSum(0x3ff0000000000000,0xbff0000000000000,*(undefined8 *)((long)kinmem + 0x110),
               *(undefined8 *)((long)kinmem + 0x108),p_Var17);
  sVar20 = KINScSNorm((KINMem)kinmem,p_Var17,*(N_Vector *)((long)kinmem + 0x110));
  if (sVar20 <= *(double *)((long)kinmem + 0x28)) {
    uVar8 = 2;
    if ((*(long *)((long)kinmem + 0x238) == 0) || (*(int *)((long)kinmem + 100) != 0))
    goto LAB_0010ba3b;
    *(undefined8 *)((long)kinmem + 200) = 0x4000000000000000;
LAB_0010ba36:
    uVar8 = 0xfffffc19;
    goto LAB_0010ba3b;
  }
  lVar13 = *(long *)((long)kinmem + 0xd0);
  uVar8 = 0xfffffffa;
  if (*(long *)((long)kinmem + 0x38) <= lVar13) goto LAB_0010ba3b;
  if (bVar18) {
    pcVar11 = (char *)(*(long *)((long)kinmem + 0x100) + 1);
    *(char **)((long)kinmem + 0x100) = pcVar11;
    uVar8 = 0xfffffff9;
    if (pcVar11 == (char *)0x5) goto LAB_0010ba3b;
  }
  else {
    *(undefined8 *)((long)kinmem + 0x100) = 0;
  }
  if (*(int *)((long)kinmem + 0x250) != 0) {
    *(sunrealtype *)((long)kinmem + 200) = sVar20;
    goto LAB_0010ba36;
  }
  uVar8 = 0xfffffc19;
  if (*(int *)((long)kinmem + 0x6c) != 0) goto LAB_0010ba3b;
  pcVar11 = (char *)(lVar13 - *(long *)((long)kinmem + 0xe8));
  if ((long)pcVar11 < *(long *)((long)kinmem + 0x48)) {
    if (*(int *)((long)kinmem + 0x70) == 0) {
      if (*(int *)((long)kinmem + 0x74) != 0) {
        *(undefined8 *)((long)kinmem + 0x280) = *(undefined8 *)((long)kinmem + 0x260);
        goto LAB_0010bb47;
      }
    }
    else {
      *(undefined8 *)((long)kinmem + 0x280) = *(undefined8 *)((long)kinmem + 0x260);
      if (*(int *)((long)kinmem + 0x74) != 0) {
LAB_0010bb47:
        *(undefined4 *)((long)kinmem + 0x74) = 0;
      }
    }
  }
  else {
    *(long *)((long)kinmem + 0xe8) = lVar13;
    if (*(int *)((long)kinmem + 0x288) == 0) {
      dVar21 = *(double *)((long)kinmem + 0x290);
    }
    else {
      dVar21 = *(double *)((long)kinmem + 0x260) / *(double *)((long)kinmem + 0x20) + -1.0;
      dVar31 = 0.0;
      if (0.0 <= dVar21) {
        dVar31 = dVar21;
      }
      if (dVar31 <= 12.0) {
        dVar22 = *(double *)((long)kinmem + 0x298);
        dVar24 = exp(dVar31);
        dVar21 = *(double *)((long)kinmem + 0x2a0);
        if (dVar24 * dVar22 < dVar21) {
          dVar22 = *(double *)((long)kinmem + 0x298);
          dVar21 = exp(dVar31);
          dVar21 = dVar21 * dVar22;
        }
      }
      else {
        dVar21 = *(double *)((long)kinmem + 0x2a0);
      }
      *(double *)((long)kinmem + 0x290) = dVar21;
    }
    if (dVar21 * *(double *)((long)kinmem + 0x280) < *(double *)((long)kinmem + 0x260)) {
      if ((*(long *)((long)kinmem + 0x238) == 0) || (*(int *)((long)kinmem + 100) != 0))
      goto LAB_0010ba3b;
      uVar19 = 0x4000000000000000;
      goto LAB_0010bc01;
    }
    *(double *)((long)kinmem + 0x280) = *(double *)((long)kinmem + 0x260);
  }
  uVar19 = 0x3ff0000000000000;
LAB_0010bc01:
  *(undefined8 *)((long)kinmem + 200) = uVar19;
  goto LAB_0010ba3b;
LAB_0010bc53:
  KINPrintInfo(pKVar14,1,pcVar15,pcVar11,"Return value: %d",0xfffffff1);
  goto switchD_0010bd25_caseD_fffffff1;
LAB_0010b90b:
  uVar8 = 0xfffffffb;
  if (*(int *)((long)kinmem + 0x30) == 0) {
    uVar8 = 2;
  }
LAB_0010ba3b:
  pKVar14 = *(KINMem *)((long)kinmem + 0x110);
  N_VScale(0x3ff0000000000000,pKVar14,*(undefined8 *)((long)kinmem + 0x108));
  *(undefined8 *)((long)kinmem + 0x268) = local_c8._0_8_;
  psVar32 = *(sunrealtype **)((long)kinmem + 0xd8);
  KINPrintInfo(pKVar14,2,module_12,pcVar11,"nni = %4ld, nfe = %6ld, fnorm = %26.16lg",
               *(undefined8 *)((long)kinmem + 0x260),*(undefined8 *)((long)kinmem + 0xd0),psVar32);
  uVar12 = 0xfffffc19;
  pcVar15 = extraout_RDX_33;
  if (uVar8 != 0xfffffc19) goto LAB_0010bcf4;
  goto LAB_0010aad8;
LAB_0010bcd1:
  pcVar11 = (char *)0xfffffffa;
  if (lVar13 < lVar5) {
    pcVar11 = (char *)0xfffffc19;
  }
  pcVar15 = extraout_RDX_11;
  p_Var16 = (N_Vector)0x0;
  if (dVar21 < dVar25) {
    p_Var16 = (N_Vector)pcVar11;
  }
LAB_0010bdb2:
  iVar7 = (int)p_Var16;
LAB_0010a27e:
  KINPrintInfo(pKVar14,1,pcVar15,pcVar11,"Return value: %d",p_Var16,psVar32);
  return iVar7;
LAB_0010bcf4:
  KINPrintInfo(pKVar14,1,pcVar15,pcVar11,"Return value: %d",(ulong)uVar8,psVar32);
  switch(uVar8) {
  case 0xfffffff1:
switchD_0010bd25_caseD_fffffff1:
    pcVar11 = "KINSol";
    pcVar15 = "Unable to correct repeated recoverable system function errors.";
    uVar8 = 0xfffffff1;
    iVar9 = -0xf;
    iVar7 = 0x2e6;
    break;
  default:
    goto switchD_0010bd25_caseD_fffffff2;
  case 0xfffffff3:
switchD_0010bd25_caseD_fffffff3:
    pcVar11 = "KINSol";
    pcVar15 = "The system function failed in an unrecoverable manner.";
    uVar8 = 0xfffffff3;
    iVar9 = -0xd;
    iVar7 = 0x2e2;
    break;
  case 0xfffffff4:
    pcVar11 = "KINSol";
    pcVar15 = "The linear solver\'s solve function failed in an unrecoverable manner.";
    uVar8 = 0xfffffff4;
    iVar9 = -0xc;
    iVar7 = 0x2ee;
    break;
  case 0xfffffff5:
    pcVar11 = "KINSol";
    pcVar15 = "The linear solver\'s setup function failed in an unrecoverable manner.";
    uVar8 = 0xfffffff5;
    iVar9 = -0xb;
    iVar7 = 0x2ea;
    break;
  case 0xfffffff7:
    pcVar11 = "KINSol";
    pcVar15 = 
    "The linear solver\'s solve function failed recoverably, but the Jacobian data is already current."
    ;
    uVar8 = 0xfffffff7;
    iVar9 = -9;
    iVar7 = 0x2f2;
    break;
  case 0xfffffff8:
switchD_0010bd25_caseD_fffffff8:
    pcVar11 = "KINSol";
    pcVar15 = 
    "The line search algorithm was unable to satisfy the beta-condition for nbcfails iterations.";
    uVar8 = 0xfffffff8;
    iVar9 = -8;
    iVar7 = 0x2fa;
    break;
  case 0xfffffff9:
    pcVar11 = "KINSol";
    pcVar15 = "Five consecutive steps have been taken that satisfy a scaled step length test.";
    uVar8 = 0xfffffff9;
    iVar9 = -7;
    iVar7 = 0x302;
    break;
  case 0xfffffffa:
    pcVar11 = "KINSol";
    pcVar15 = "The maximum number of iterations was reached before convergence.";
    uVar8 = 0xfffffffa;
    iVar9 = -6;
    iVar7 = 0x2fe;
    break;
  case 0xfffffffb:
    pcVar11 = "KINSol";
    pcVar15 = 
    "The line search algorithm was unable to find an iterate sufficiently distinct from the current iterate."
    ;
    uVar8 = 0xfffffffb;
    iVar9 = -5;
    iVar7 = 0x2f6;
  }
LAB_0010a4cb:
  KINProcessError((KINMem)kinmem,iVar9,iVar7,pcVar11,
                  "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/kinsol/kinsol.c"
                  ,pcVar15);
switchD_0010bd25_caseD_fffffff2:
  return uVar8;
}

Assistant:

int KINSol(void* kinmem, N_Vector u, int strategy_in, N_Vector u_scale,
           N_Vector f_scale)
{
  sunrealtype fnormp, f1normp, epsmin;
  KINMem kin_mem;
  int ret, sflag;
  sunbooleantype maxStepTaken;

  /* initialize to avoid compiler warning messages */

  maxStepTaken = SUNFALSE;
  f1normp = fnormp = -ONE;

  /* initialize epsmin to avoid compiler warning message */

  epsmin = ZERO;

  /* check for kinmem non-NULL */

  if (kinmem == NULL)
  {
    KINProcessError(NULL, KIN_MEM_NULL, __LINE__, __func__, __FILE__, MSG_NO_MEM);
    return (KIN_MEM_NULL);
  }
  kin_mem = (KINMem)kinmem;

  SUNDIALS_MARK_FUNCTION_BEGIN(KIN_PROFILER);

  if (kin_mem->kin_MallocDone == SUNFALSE)
  {
    KINProcessError(kin_mem, KIN_NO_MALLOC, __LINE__, __func__, __FILE__,
                    MSG_NO_MALLOC);
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (KIN_NO_MALLOC);
  }

  /* load input arguments */

  kin_mem->kin_uu             = u;
  kin_mem->kin_uscale         = u_scale;
  kin_mem->kin_fscale         = f_scale;
  kin_mem->kin_globalstrategy = strategy_in;

  /* CSW:
     Call fixed point solver if requested.  Note that this should probably
     be forked off to a FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_FP)
  {
    if (kin_mem->kin_uu == NULL)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_UU_NULL);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

    if (kin_mem->kin_constraintsSet != SUNFALSE)
    {
      KINProcessError(kin_mem, KIN_ILL_INPUT, __LINE__, __func__, __FILE__,
                      MSG_CONSTRAINTS_NOTOK);
      SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
      return (KIN_ILL_INPUT);
    }

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_TOL, "KINSOL", __func__, INFO_TOL,
                 kin_mem->kin_scsteptol, kin_mem->kin_fnormtol);
#endif

    kin_mem->kin_nfe = kin_mem->kin_nnilset = kin_mem->kin_nnilset_sub =
      kin_mem->kin_nni = kin_mem->kin_nbcf = kin_mem->kin_nbktrk = 0;
    ret = KINFP(kin_mem);

    switch (ret)
    {
    case KIN_SYSFUNC_FAIL:
      KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                      MSG_SYSFUNC_FAILED);
      break;
    case KIN_MAXITER_REACHED:
      KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__,
                      __FILE__, MSG_MAXITER_REACHED);
      break;
    }

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  /* initialize solver */
  ret = KINSolInit(kin_mem);
  if (ret != KIN_SUCCESS)
  {
    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  kin_mem->kin_ncscmx = 0;

  /* Note: The following logic allows the choice of whether or not
     to force a call to the linear solver setup upon a given call to
     KINSol */

  if (kin_mem->kin_noInitSetup) { kin_mem->kin_sthrsh = ONE; }
  else { kin_mem->kin_sthrsh = TWO; }

  /* if eps is to be bounded from below, set the bound */

  if (kin_mem->kin_inexact_ls && !(kin_mem->kin_noMinEps))
  {
    epsmin = POINT01 * kin_mem->kin_fnormtol;
  }

  /* if omega is zero at this point, make sure it will be evaluated
     at each iteration based on the provided min/max bounds and the
     current function norm. */
  if (kin_mem->kin_omega == ZERO) { kin_mem->kin_eval_omega = SUNTRUE; }
  else { kin_mem->kin_eval_omega = SUNFALSE; }

  /* CSW:
     Call fixed point solver for Picard method if requested.
     Note that this should probably be forked off to a part of an
     FPSOL solver instead of kinsol in the future. */
  if (kin_mem->kin_globalstrategy == KIN_PICARD)
  {
    if (kin_mem->kin_gval == NULL)
    {
      kin_mem->kin_gval = N_VClone(kin_mem->kin_unew);
      if (kin_mem->kin_gval == NULL)
      {
        KINProcessError(kin_mem, KIN_MEM_FAIL, __LINE__, __func__, __FILE__,
                        MSG_MEM_FAIL);
        SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
        return (KIN_MEM_FAIL);
      }
      kin_mem->kin_liw += kin_mem->kin_liw1;
      kin_mem->kin_lrw += kin_mem->kin_lrw1;
    }
    ret = KINPicardAA(kin_mem);

    SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
    return (ret);
  }

  for (;;)
  {
    kin_mem->kin_retry_nni = SUNFALSE;

    kin_mem->kin_nni++;

    /* calculate the epsilon (stopping criteria for iterative linear solver)
       for this iteration based on eta from the routine KINForcingTerm */

    if (kin_mem->kin_inexact_ls)
    {
      kin_mem->kin_eps = (kin_mem->kin_eta + kin_mem->kin_uround) *
                         kin_mem->kin_fnorm;
      if (!(kin_mem->kin_noMinEps))
      {
        kin_mem->kin_eps = SUNMAX(epsmin, kin_mem->kin_eps);
      }
    }

  repeat_nni:

    /* call the appropriate routine to calculate an acceptable step pp */

    sflag = 0;

    if (kin_mem->kin_globalstrategy == KIN_NONE)
    {
      /* Full Newton Step*/

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINFullNewton(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }
    }
    else if (kin_mem->kin_globalstrategy == KIN_LINESEARCH)
    {
      /* Line Search */

      /* call KINLinSolDrv to calculate the (approximate) Newton step, pp */
      ret = KINLinSolDrv(kin_mem);
      if (ret != KIN_SUCCESS) { break; }

      sflag = KINLineSearch(kin_mem, &fnormp, &f1normp, &maxStepTaken);

      /* if sysfunc failed unrecoverably, stop */
      if ((sflag == KIN_SYSFUNC_FAIL) || (sflag == KIN_REPTD_SYSFUNC_ERR))
      {
        ret = sflag;
        break;
      }

      /* if too many beta condition failures, then stop iteration */
      if (kin_mem->kin_nbcf > kin_mem->kin_mxnbcf)
      {
        ret = KIN_LINESEARCH_BCFAIL;
        break;
      }
    }

    if ((kin_mem->kin_globalstrategy != KIN_PICARD) &&
        (kin_mem->kin_globalstrategy != KIN_FP))
    {
      /* evaluate eta by calling the forcing term routine */
      if (kin_mem->kin_callForcingTerm) { KINForcingTerm(kin_mem, fnormp); }

      kin_mem->kin_fnorm = fnormp;

      /* call KINStop to check if tolerances where met by this iteration */
      ret = KINStop(kin_mem, maxStepTaken, sflag);

      if (ret == RETRY_ITERATION)
      {
        kin_mem->kin_retry_nni = SUNTRUE;
        goto repeat_nni;
      }
    }

    /* update uu after the iteration */
    N_VScale(ONE, kin_mem->kin_unew, kin_mem->kin_uu);

    kin_mem->kin_f1norm = f1normp;

    /* print the current nni, fnorm, and nfe values */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
    KINPrintInfo(kin_mem, PRNT_NNI, "KINSOL", __func__, INFO_NNI,
                 kin_mem->kin_nni, kin_mem->kin_nfe, kin_mem->kin_fnorm);
#endif

    if (ret != CONTINUE_ITERATIONS) { break; }

  } /* end of loop; return */

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGLEVEL_INFO
  KINPrintInfo(kin_mem, PRNT_RETVAL, "KINSOL", __func__, INFO_RETVAL, ret);
#endif

  switch (ret)
  {
  case KIN_SYSFUNC_FAIL:
    KINProcessError(kin_mem, KIN_SYSFUNC_FAIL, __LINE__, __func__, __FILE__,
                    MSG_SYSFUNC_FAILED);
    break;
  case KIN_REPTD_SYSFUNC_ERR:
    KINProcessError(kin_mem, KIN_REPTD_SYSFUNC_ERR, __LINE__, __func__,
                    __FILE__, MSG_SYSFUNC_REPTD);
    break;
  case KIN_LSETUP_FAIL:
    KINProcessError(kin_mem, KIN_LSETUP_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSETUP_FAILED);
    break;
  case KIN_LSOLVE_FAIL:
    KINProcessError(kin_mem, KIN_LSOLVE_FAIL, __LINE__, __func__, __FILE__,
                    MSG_LSOLVE_FAILED);
    break;
  case KIN_LINSOLV_NO_RECOVERY:
    KINProcessError(kin_mem, KIN_LINSOLV_NO_RECOVERY, __LINE__, __func__,
                    __FILE__, MSG_LINSOLV_NO_RECOVERY);
    break;
  case KIN_LINESEARCH_NONCONV:
    KINProcessError(kin_mem, KIN_LINESEARCH_NONCONV, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_NONCONV);
    break;
  case KIN_LINESEARCH_BCFAIL:
    KINProcessError(kin_mem, KIN_LINESEARCH_BCFAIL, __LINE__, __func__,
                    __FILE__, MSG_LINESEARCH_BCFAIL);
    break;
  case KIN_MAXITER_REACHED:
    KINProcessError(kin_mem, KIN_MAXITER_REACHED, __LINE__, __func__, __FILE__,
                    MSG_MAXITER_REACHED);
    break;
  case KIN_MXNEWT_5X_EXCEEDED:
    KINProcessError(kin_mem, KIN_MXNEWT_5X_EXCEEDED, __LINE__, __func__,
                    __FILE__, MSG_MXNEWT_5X_EXCEEDED);
    break;
  }

  SUNDIALS_MARK_FUNCTION_END(KIN_PROFILER);
  return (ret);
}